

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall OpticsParser::Parser::parseAERCID(Parser *this,string *line,ProductData *product)

{
  size_type sVar1;
  int local_60;
  _Optional_payload_base<int> local_5c [2];
  size_type local_48;
  size_type erasePos;
  string str;
  ProductData *product_local;
  string *line_local;
  Parser *this_local;
  
  str.field_2._8_8_ = product;
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,"AERC",0);
  if (sVar1 != 0xffffffffffffffff) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (line,"ID:",0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&erasePos,line,
               sVar1 + 3,0xffffffffffffffff);
    local_48 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &erasePos,'}',0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&erasePos,
               local_48,1);
    local_60 = std::__cxx11::stoi((string *)&erasePos,(size_t *)0x0,10);
    std::optional<int>::optional<int,_true>((optional<int> *)local_5c,&local_60);
    *(_Optional_payload_base<int> *)(str.field_2._8_8_ + 0x5e0) = local_5c[0];
    std::__cxx11::string::~string((string *)&erasePos);
  }
  return;
}

Assistant:

void Parser::parseAERCID(const std::string & line, ProductData & product)
    {
        if(line.find("AERC") != std::string::npos)
        {
            std::string str = line.substr(line.find("ID:") + 3);
            auto erasePos = str.find('}');
            str.erase(erasePos, 1);
            product.aercID = std::stoi(str);
        }
    }